

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool anon_unknown.dwarf_15ba04a::
     cmRt2CtSelector<std::less_equal,_std::greater,_std::greater_equal,_std::equal_to>::eval<double>
               (int r,double lhs,double rhs)

{
  less_equal<double> local_21;
  double local_20;
  double rhs_local;
  double lhs_local;
  int r_local;
  
  if (r == 0) {
    lhs_local._7_1_ = false;
  }
  else {
    local_20 = rhs;
    rhs_local = lhs;
    lhs_local._0_4_ = r;
    if (r == 1) {
      lhs_local._7_1_ = std::less_equal<double>::operator()(&local_21,&rhs_local,&local_20);
    }
    else {
      lhs_local._7_1_ =
           cmRt2CtSelector<std::greater,_std::greater_equal,_std::equal_to>::eval<double>
                     (r + -1,lhs,rhs);
    }
  }
  return lhs_local._7_1_;
}

Assistant:

static bool eval(int r, T lhs, T rhs)
  {
    switch (r) {
      case 0:
        return false;
      case 1:
        return Comp<T>()(lhs, rhs);
      default:
        return cmRt2CtSelector<Ops...>::eval(r - 1, lhs, rhs);
    }
  }